

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O2

string * __thiscall hdc::Def::getUniqueCppName_abi_cxx11_(string *__return_storage_ptr__,Def *this)

{
  ostream *poVar1;
  stringstream s;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (this->klass == (Class *)0x0) {
    poVar1 = std::operator<<(local_190,"d");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->id);
    poVar1 = std::operator<<(poVar1,"_");
    getName_abi_cxx11_(&local_1c0,this);
    std::operator<<(poVar1,(string *)&local_1c0);
  }
  else {
    poVar1 = std::operator<<(local_190,"m");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->id);
    poVar1 = std::operator<<(poVar1,"_");
    getName_abi_cxx11_(&local_1c0,this);
    std::operator<<(poVar1,(string *)&local_1c0);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Def::getUniqueCppName() {
    std::stringstream s;

    if (isMethod()) {
        s << "m" << id << "_" << getName();
    } else {
        s << "d" << id << "_" << getName();
    }

    return s.str();
}